

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue_p.h
# Opt level: O0

QCborValueRef
QCborContainerPrivate::findOrAddMapKey<QCborValue_const&>
          (QCborContainerPrivate *container,QCborValue *key)

{
  long in_RDI;
  long in_FS_OFFSET;
  QCborValueConstRef QVar1;
  qsizetype index;
  qsizetype size;
  QCborContainerPrivate *in_stack_ffffffffffffff58;
  QCborContainerPrivate *in_stack_ffffffffffffff60;
  QCborValue *in_stack_ffffffffffffff90;
  QCborContainerPrivate *in_stack_ffffffffffffff98;
  qsizetype local_60;
  qsizetype local_58;
  long local_40;
  longlong local_38;
  QCborContainerPrivate *local_30;
  qsizetype local_28;
  QCborValue local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = 0;
  local_58 = 1;
  if (in_RDI != 0) {
    local_38 = QList<QtCbor::Element>::size((QList<QtCbor::Element> *)(in_RDI + 0x28));
    QVar1 = findCborMapKey<QCborValue_const&>(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    local_60 = QVar1.i;
    local_58 = local_60;
  }
  local_40 = local_58 + 1;
  qMax<long_long>(&local_40,&local_38);
  detach(in_stack_ffffffffffffff58,0x48390f);
  if (local_38 <= local_58) {
    append(in_stack_ffffffffffffff60,(QCborValue *)in_stack_ffffffffffffff58);
    ::QCborValue::QCborValue(local_20);
    append(in_stack_ffffffffffffff60,(QCborValue *)in_stack_ffffffffffffff58);
    ::QCborValue::~QCborValue((QCborValue *)in_stack_ffffffffffffff60);
  }
  QCborValueRef::QCborValueRef
            ((QCborValueRef *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,0x4839a0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    QVar1.i = local_28;
    QVar1.d = local_30;
    return (QCborValueRef)QVar1;
  }
  __stack_chk_fail();
}

Assistant:

static QCborValueRef
    findOrAddMapKey(QCborContainerPrivate *container, KeyType key)
    {
        qsizetype size = 0;
        qsizetype index = size + 1;
        if (container) {
            size = container->elements.size();
            index = container->findCborMapKey<KeyType>(key).i; // returns size + 1 if not found
        }
        Q_ASSERT(index & 1);
        Q_ASSERT((size & 1) == 0);

        container = detach(container, qMax(index + 1, size));
        Q_ASSERT(container);
        Q_ASSERT((container->elements.size() & 1) == 0);

        if (index >= size) {
            container->append(key);
            container->append(QCborValue());
        }
        Q_ASSERT(index < container->elements.size());
        return { container, index };
    }